

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O2

int __thiscall MeCab::CharProperty::open(CharProperty *this,char *__file,int __oflag,...)

{
  int iVar1;
  int __oflag_00;
  string filename;
  string prefix;
  allocator local_69;
  string local_68;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  Param::get<std::__cxx11::string>(&local_28,(Param *)__file,"dicdir");
  std::__cxx11::string::string((string *)&local_68,"char.bin",&local_69);
  create_filename(&local_48,&local_28,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  iVar1 = open(this,local_48._M_dataplus._M_p,__oflag_00);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return iVar1;
}

Assistant:

bool CharProperty::open(const Param &param) {
  const std::string prefix   = param.get<std::string>("dicdir");
  const std::string filename = create_filename(prefix, CHAR_PROPERTY_FILE);
  return open(filename.c_str());
}